

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rulebasedcollator.cpp
# Opt level: O3

UCollationResult __thiscall
icu_63::RuleBasedCollator::compareUTF8
          (RuleBasedCollator *this,StringPiece *left,StringPiece *right,UErrorCode *errorCode)

{
  byte *pbVar1;
  byte bVar2;
  uint uVar3;
  uint8_t *s;
  uint8_t *puVar4;
  CollationData *pCVar5;
  Normalizer2Impl *nfcImpl;
  uint8_t uVar6;
  UBool UVar7;
  UCollationResult UVar8;
  uint uVar9;
  ulong uVar10;
  long lVar11;
  uint uVar12;
  uint uVar13;
  ulong uVar14;
  byte bVar15;
  CollationSettings *settings;
  uint uVar16;
  int rightLength;
  int32_t leftLength;
  uint leftLength_00;
  byte bStack_479;
  uint uStack_474;
  CollationSettings **ppCStack_470;
  UErrorCode *pUStack_468;
  ulong uStack_460;
  RuleBasedCollator *pRStack_458;
  undefined1 auStack_450 [40];
  UTrie2 *pUStack_428;
  CollationData *pCStack_420;
  undefined4 uStack_418;
  long *plStack_410;
  undefined4 uStack_408;
  undefined1 uStack_404;
  long alStack_400 [36];
  int32_t iStack_2e0;
  SkippedState *pSStack_2d8;
  int32_t iStack_2d0;
  byte bStack_2cc;
  uint8_t *puStack_2c8;
  uint uStack_2c0;
  uint uStack_2bc;
  long lStack_2b8;
  int32_t iStack_2b0;
  undefined1 uStack_2ac;
  Normalizer2Impl *pNStack_2a8;
  Replaceable RStack_2a0;
  undefined1 auStack_298 [88];
  undefined1 auStack_240 [40];
  UTrie2 *pUStack_218;
  CollationData *pCStack_210;
  undefined4 uStack_208;
  long *plStack_200;
  undefined4 uStack_1f8;
  undefined1 uStack_1f4;
  long alStack_1f0 [36];
  int32_t iStack_d0;
  SkippedState *pSStack_c8;
  int32_t iStack_c0;
  byte bStack_bc;
  uint8_t *puStack_b8;
  uint uStack_b0;
  uint uStack_ac;
  long lStack_a8;
  int32_t iStack_a0;
  undefined1 uStack_9c;
  Normalizer2Impl *pNStack_98;
  Replaceable RStack_90;
  undefined1 auStack_88 [88];
  
  if (U_ZERO_ERROR < *errorCode) {
    return UCOL_EQUAL;
  }
  s = (uint8_t *)left->ptr_;
  leftLength_00 = left->length_;
  if (leftLength_00 != 0 && s == (uint8_t *)0x0) {
LAB_0021fc6d:
    *errorCode = U_ILLEGAL_ARGUMENT_ERROR;
    return UCOL_EQUAL;
  }
  puVar4 = (uint8_t *)right->ptr_;
  uVar3 = right->length_;
  if (puVar4 == (uint8_t *)0x0) {
    if (uVar3 == 0) {
      UVar8 = doCompare(this,s,leftLength_00,(uint8_t *)0x0,0,errorCode);
      return UVar8;
    }
    goto LAB_0021fc6d;
  }
  if (s == puVar4 && leftLength_00 == uVar3) {
    return UCOL_EQUAL;
  }
  uStack_474 = 0;
  pUStack_468 = errorCode;
  if ((int)leftLength_00 < 0) {
    uVar6 = *s;
    if (uVar6 == *puVar4) {
      uVar10 = 0;
      do {
        if (uVar6 == '\0') {
          return UCOL_EQUAL;
        }
        uVar14 = uVar10 + 1;
        uStack_474 = (uint)uVar14;
        uVar6 = s[uVar10 + 1];
        lVar11 = uVar10 + 1;
        uVar10 = uVar14;
      } while (uVar6 == puVar4[lVar11]);
LAB_0021fd36:
      uVar9 = (uint)uVar14;
      goto LAB_0021fd6d;
    }
    ppCStack_470 = &this->settings;
    bStack_479 = (byte)this->settings->options >> 1 & 1;
  }
  else {
    if (leftLength_00 == 0) {
LAB_0021fd3a:
      uVar14 = (ulong)leftLength_00;
      uVar9 = leftLength_00;
      if (leftLength_00 == uVar3) {
        return UCOL_EQUAL;
      }
    }
    else {
      uVar9 = uVar3;
      if (uVar3 == 0) {
        uVar14 = 0;
      }
      else {
        uVar14 = 0;
        do {
          if (s[uVar14] != puVar4[uVar14]) goto LAB_0021fd36;
          uVar10 = uVar14 + 1;
          uStack_474 = (uint)uVar10;
          if (leftLength_00 - 1 == (int)uVar14) goto LAB_0021fd3a;
          uVar14 = uVar10;
        } while ((long)(int)uVar3 != uVar10);
        uVar14 = uVar10 & 0xffffffff;
      }
    }
LAB_0021fd6d:
    uVar16 = (uint)uVar14;
    if ((0 < (int)uVar9) &&
       (((uVar9 != leftLength_00 && ((char)s[uVar9] < -0x40)) ||
        ((uVar9 != uVar3 && ((char)puVar4[uVar9] < -0x40)))))) {
      uVar10 = uVar14 & 0xffffffff;
      uVar9 = 1;
      if ((int)uVar16 < 1) {
        uVar9 = uVar16;
      }
      do {
        uVar10 = uVar10 - 1;
        uVar16 = uVar9 - 1;
        uStack_474 = uVar9 - 1;
        if ((int)uVar14 < 2) break;
        uVar16 = (int)uVar14 - 1;
        uVar14 = (ulong)uVar16;
        uStack_474 = uVar16;
      } while ((char)s[uVar10 & 0xffffffff] < -0x40);
    }
    ppCStack_470 = &this->settings;
    bStack_479 = (byte)this->settings->options >> 1 & 1;
    if (0 < (int)uVar16) {
      if (uVar16 == leftLength_00) {
LAB_0021fe12:
        if (uVar16 != uVar3) {
          uVar10 = (ulong)uVar16;
          bVar2 = puVar4[uVar10];
          uVar9 = (uint)bVar2;
          if ((char)bVar2 < '\0') {
            uVar14 = uVar10 + 1;
            uVar9 = 0xfffd;
            if ((uint)uVar14 != uVar3) {
              if (bVar2 < 0xe0) {
                if (0xc1 < bVar2) {
                  uVar16 = bVar2 & 0x1f;
LAB_002204cf:
                  if ((byte)(puVar4[uVar14 & 0xffffffff] ^ 0x80) < 0x40) {
                    uVar9 = uVar16 << 6 | puVar4[uVar14 & 0xffffffff] ^ 0x80;
                  }
                }
              }
              else if (bVar2 < 0xf0) {
                uVar16 = bVar2 & 0xf;
                if (((byte)" 000000000000\x1000"[uVar16] >> (puVar4[uVar14] >> 5) & 1) != 0) {
                  bVar15 = puVar4[uVar14] & 0x3f;
LAB_00220480:
                  uVar13 = (int)uVar14 + 1;
                  uVar14 = (ulong)uVar13;
                  if (uVar13 != uVar3) {
                    uVar16 = (uint)bVar15 | uVar16 << 6;
                    goto LAB_002204cf;
                  }
                }
              }
              else if (bVar2 < 0xf5) {
                pbVar1 = puVar4 + uVar14;
                if (((((uint)(int)""[*pbVar1 >> 4] >> (bVar2 - 0xf0 & 0x1f) & 1) != 0) &&
                    (uVar14 = uVar10 + 2, (uint)uVar14 != uVar3)) &&
                   (bVar15 = puVar4[uVar14] + 0x80, bVar15 < 0x40)) {
                  uVar16 = *pbVar1 & 0x3f | (bVar2 - 0xf0) * 0x40;
                  goto LAB_00220480;
                }
              }
            }
          }
          UVar7 = CollationData::isUnsafeBackward(this->data,uVar9,bStack_479);
          if (UVar7 != '\0') goto LAB_0021fe4d;
        }
      }
      else {
        uVar10 = (ulong)uVar16;
        bVar2 = s[uVar10];
        uVar9 = (uint)bVar2;
        if ((char)bVar2 < '\0') {
          uVar14 = uVar10 + 1;
          uVar9 = 0xfffd;
          if ((uint)uVar14 != leftLength_00) {
            if (bVar2 < 0xe0) {
              if (0xc1 < bVar2) {
                uVar13 = bVar2 & 0x1f;
LAB_002204a2:
                if ((byte)(s[uVar14 & 0xffffffff] ^ 0x80) < 0x40) {
                  uVar9 = uVar13 << 6 | s[uVar14 & 0xffffffff] ^ 0x80;
                }
              }
            }
            else if (bVar2 < 0xf0) {
              uVar13 = bVar2 & 0xf;
              if (((byte)" 000000000000\x1000"[uVar13] >> (s[uVar14] >> 5) & 1) != 0) {
                bVar15 = s[uVar14] & 0x3f;
LAB_00220438:
                uVar12 = (int)uVar14 + 1;
                uVar14 = (ulong)uVar12;
                if (uVar12 != leftLength_00) {
                  uVar13 = (uint)bVar15 | uVar13 << 6;
                  goto LAB_002204a2;
                }
              }
            }
            else if (bVar2 < 0xf5) {
              pbVar1 = s + uVar14;
              if (((((uint)(int)""[*pbVar1 >> 4] >> (bVar2 - 0xf0 & 0x1f) & 1) != 0) &&
                  (uVar14 = uVar10 + 2, (uint)uVar14 != leftLength_00)) &&
                 (bVar15 = s[uVar14] + 0x80, bVar15 < 0x40)) {
                uVar13 = *pbVar1 & 0x3f | (bVar2 - 0xf0) * 0x40;
                goto LAB_00220438;
              }
            }
          }
        }
        UVar7 = CollationData::isUnsafeBackward(this->data,uVar9,bStack_479);
        if (UVar7 == '\0') goto LAB_0021fe12;
LAB_0021fe4d:
        do {
          lVar11 = (long)(int)uStack_474;
          uStack_474 = uStack_474 - 1;
          bVar2 = s[lVar11 + -1];
          uVar9 = (uint)bVar2;
          if ((char)bVar2 < '\0') {
            uVar9 = utf8_prevCharSafeBody_63(s,0,(int32_t *)&uStack_474,(uint)bVar2,-3);
          }
          if ((int)uStack_474 < 1) break;
          UVar7 = CollationData::isUnsafeBackward(this->data,uVar9,bStack_479);
        } while (UVar7 != '\0');
      }
    }
  }
  settings = *ppCStack_470;
  if (((-1 < settings->fastLatinOptions) &&
      ((lVar11 = (long)(int)uStack_474, leftLength_00 == uStack_474 || (s[lVar11] < 0xc6)))) &&
     ((uVar3 == uStack_474 || (puVar4[lVar11] < 0xc6)))) {
    if ((int)leftLength_00 < 0) {
      rightLength = -1;
      leftLength = -1;
    }
    else {
      leftLength = leftLength_00 - uStack_474;
      rightLength = uVar3 - uStack_474;
    }
    UVar8 = CollationFastLatin::compareUTF8
                      (this->data->fastLatinTable,settings->fastLatinPrimaries,
                       settings->fastLatinOptions,s + lVar11,leftLength,puVar4 + lVar11,rightLength)
    ;
    if (UVar8 != ~UCOL_GREATER) goto LAB_002201ab;
    settings = *ppCStack_470;
  }
  puStack_2c8 = puVar4;
  uStack_2bc = uVar3;
  puStack_b8 = s;
  uStack_ac = leftLength_00;
  if ((settings->options & 1) == 0) {
    auStack_450._16_8_ = this->data;
    auStack_450._8_8_ = *(undefined8 *)auStack_450._16_8_;
    auStack_240._32_8_ = &pCStack_210;
    auStack_240._24_8_ = (ulong)(uint)auStack_240._28_4_ << 0x20;
    pUStack_218 = (UTrie2 *)CONCAT35(pUStack_218._5_3_,0x28);
    iStack_d0 = 0;
    pSStack_c8 = (SkippedState *)0x0;
    iStack_c0 = -1;
    bStack_bc = bStack_479;
    auStack_240._0_8_ = &PTR__UTF8CollationIterator_003b0020;
    uStack_b0 = uStack_474;
    auStack_450._32_8_ = &pCStack_420;
    auStack_450._24_8_ = (ulong)(uint)auStack_450._28_4_ << 0x20;
    pUStack_428 = (UTrie2 *)CONCAT35(pUStack_428._5_3_,0x28);
    iStack_2e0 = 0;
    pSStack_2d8 = (SkippedState *)0x0;
    iStack_2d0 = -1;
    bStack_2cc = bStack_479;
    auStack_450._0_8_ = &PTR__UTF8CollationIterator_003b0020;
    uStack_2c0 = uStack_474;
    auStack_240._8_8_ = auStack_450._8_8_;
    auStack_240._16_8_ = auStack_450._16_8_;
    UVar8 = CollationCompare::compareUpToQuaternary
                      ((CollationIterator *)auStack_240,(CollationIterator *)auStack_450,settings,
                       pUStack_468);
    UTF8CollationIterator::~UTF8CollationIterator((UTF8CollationIterator *)auStack_450);
    UTF8CollationIterator::~UTF8CollationIterator((UTF8CollationIterator *)auStack_240);
  }
  else {
    auStack_450._16_8_ = this->data;
    auStack_450._8_8_ = *(undefined8 *)auStack_450._16_8_;
    auStack_240._32_8_ = &pCStack_210;
    auStack_240._24_8_ = (ulong)(uint)auStack_240._28_4_ << 0x20;
    pUStack_218 = (UTrie2 *)CONCAT35(pUStack_218._5_3_,0x28);
    iStack_d0 = 0;
    pSStack_c8 = (SkippedState *)0x0;
    iStack_c0 = -1;
    bStack_bc = bStack_479;
    uStack_b0 = uStack_474;
    auStack_240._0_8_ = &PTR__FCDUTF8CollationIterator_003aff90;
    lStack_a8 = (ulong)uStack_474 << 0x20;
    pNStack_2a8 = *(Normalizer2Impl **)(auStack_450._16_8_ + 0x30);
    RStack_90.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_003bc258;
    auStack_88._0_2_ = 2;
    auStack_450._32_8_ = &pCStack_420;
    auStack_450._24_8_ = (ulong)(uint)auStack_450._28_4_ << 0x20;
    pUStack_428 = (UTrie2 *)CONCAT35(pUStack_428._5_3_,0x28);
    iStack_2e0 = 0;
    pSStack_2d8 = (SkippedState *)0x0;
    iStack_2d0 = -1;
    bStack_2cc = bStack_479;
    uStack_2c0 = uStack_474;
    auStack_450._0_8_ = &PTR__FCDUTF8CollationIterator_003aff90;
    lStack_2b8 = (ulong)uStack_474 << 0x20;
    RStack_2a0.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_003bc258;
    auStack_298._0_2_ = 2;
    uStack_460 = (ulong)leftLength_00;
    pRStack_458 = this;
    auStack_240._8_8_ = auStack_450._8_8_;
    auStack_240._16_8_ = auStack_450._16_8_;
    pNStack_98 = pNStack_2a8;
    UVar8 = CollationCompare::compareUpToQuaternary
                      ((CollationIterator *)auStack_240,(CollationIterator *)auStack_450,settings,
                       pUStack_468);
    FCDUTF8CollationIterator::~FCDUTF8CollationIterator((FCDUTF8CollationIterator *)auStack_450);
    FCDUTF8CollationIterator::~FCDUTF8CollationIterator((FCDUTF8CollationIterator *)auStack_240);
    leftLength_00 = (uint)uStack_460;
    this = pRStack_458;
  }
LAB_002201ab:
  if (UVar8 == UCOL_EQUAL) {
    UVar8 = UCOL_EQUAL;
    if ((0xefff < (*ppCStack_470)->options) &&
       (UVar8 = UCOL_EQUAL, *pUStack_468 < U_ILLEGAL_ARGUMENT_ERROR)) {
      pCVar5 = this->data;
      uVar9 = 0;
      if (0 < (int)leftLength_00) {
        uVar9 = uStack_474;
      }
      nfcImpl = pCVar5->nfcImpl;
      if (((*ppCStack_470)->options & 1U) == 0) {
        auStack_240._24_8_ = 0xffffffff;
        auStack_240._0_8_ = &PTR__UObject_003af9e8;
        pUStack_218 = (UTrie2 *)((ulong)(leftLength_00 - uVar9) << 0x20);
        auStack_450._24_8_ = 0xffffffff;
        auStack_450._0_8_ = &PTR__UObject_003af9e8;
        pUStack_428 = (UTrie2 *)((ulong)(uVar3 - uVar9) << 0x20);
        auStack_450._32_8_ = (Normalizer2Impl *)(puVar4 + (int)uStack_474);
        auStack_240._32_8_ = (Normalizer2Impl *)(s + (int)uStack_474);
        UVar8 = anon_unknown_16::compareNFDIter
                          (nfcImpl,(NFDIterator *)auStack_240,(NFDIterator *)auStack_450);
        UObject::~UObject((UObject *)auStack_450);
      }
      else {
        auStack_240._24_8_ = 0xffffffff;
        auStack_240._0_8_ = &PTR__FCDUTF8NFDIterator_003afa30;
        pUStack_428 = pCVar5->trie;
        uStack_208 = 0;
        plStack_200 = alStack_1f0;
        uStack_1f8 = 0x28;
        uStack_1f4 = 0;
        uStack_b0 = 0;
        lStack_a8 = 0;
        iStack_a0 = -1;
        uStack_9c = 0;
        RStack_90.super_UObject._vptr_UObject = (UObject)((ulong)(leftLength_00 - uVar9) << 0x20);
        auStack_240._32_8_ = &PTR__FCDUTF8CollationIterator_003aff90;
        auStack_88._0_8_ = 0;
        auStack_88._24_8_ = &PTR__UnicodeString_003bc258;
        auStack_88._32_2_ = L'\x02';
        auStack_450._24_8_ = 0xffffffff;
        auStack_450._0_8_ = &PTR__FCDUTF8NFDIterator_003afa30;
        uStack_418 = 0;
        plStack_410 = alStack_400;
        uStack_408 = 0x28;
        uStack_404 = 0;
        uStack_2c0 = 0;
        lStack_2b8 = 0;
        iStack_2b0 = -1;
        uStack_2ac = 0;
        RStack_2a0.super_UObject._vptr_UObject = (UObject)((ulong)(uVar3 - uVar9) << 0x20);
        auStack_450._32_8_ = &PTR__FCDUTF8CollationIterator_003aff90;
        auStack_298._0_8_ = 0;
        auStack_298._24_8_ = &PTR__UnicodeString_003bc258;
        auStack_298._32_2_ = L'\x02';
        pCStack_420 = pCVar5;
        pNStack_2a8 = (Normalizer2Impl *)(puVar4 + (int)uStack_474);
        auStack_298._16_8_ = nfcImpl;
        pUStack_218 = pUStack_428;
        pCStack_210 = pCVar5;
        pNStack_98 = (Normalizer2Impl *)(s + (int)uStack_474);
        auStack_88._16_8_ = nfcImpl;
        UVar8 = anon_unknown_16::compareNFDIter
                          (nfcImpl,(NFDIterator *)auStack_240,(NFDIterator *)auStack_450);
        auStack_450._0_8_ = &PTR__FCDUTF8NFDIterator_003afa30;
        FCDUTF8CollationIterator::~FCDUTF8CollationIterator
                  ((FCDUTF8CollationIterator *)(auStack_450 + 0x20));
        UObject::~UObject((UObject *)auStack_450);
        auStack_240._0_8_ = &PTR__FCDUTF8NFDIterator_003afa30;
        FCDUTF8CollationIterator::~FCDUTF8CollationIterator
                  ((FCDUTF8CollationIterator *)(auStack_240 + 0x20));
      }
      UObject::~UObject((UObject *)auStack_240);
    }
  }
  return UVar8;
}

Assistant:

UCollationResult
RuleBasedCollator::compareUTF8(const StringPiece &left, const StringPiece &right,
                               UErrorCode &errorCode) const {
    if(U_FAILURE(errorCode)) { return UCOL_EQUAL; }
    const uint8_t *leftBytes = reinterpret_cast<const uint8_t *>(left.data());
    const uint8_t *rightBytes = reinterpret_cast<const uint8_t *>(right.data());
    if((leftBytes == NULL && !left.empty()) || (rightBytes == NULL && !right.empty())) {
        errorCode = U_ILLEGAL_ARGUMENT_ERROR;
        return UCOL_EQUAL;
    }
    return doCompare(leftBytes, left.length(), rightBytes, right.length(), errorCode);
}